

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int nodeReaderNext(NodeReader *p)

{
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  uint local_24;
  int rc;
  int nSuffix;
  int nPrefix;
  int bFirst;
  NodeReader *p_local;
  
  nSuffix = (int)((p->term).n == 0);
  rc = 0;
  local_24 = 0;
  local_28 = 0;
  if ((p->iChild != 0) && (nSuffix == 0)) {
    p->iChild = p->iChild + 1;
  }
  if (p->iOff < p->nNode) {
    _nPrefix = p;
    if (nSuffix == 0) {
      if ((p->aNode[p->iOff] & 0x80U) == 0) {
        rc = (int)(byte)p->aNode[p->iOff];
        local_2c = 1;
      }
      else {
        local_2c = sqlite3Fts3GetVarint32(p->aNode + p->iOff,&rc);
      }
      _nPrefix->iOff = local_2c + _nPrefix->iOff;
    }
    if ((_nPrefix->aNode[_nPrefix->iOff] & 0x80U) == 0) {
      local_24 = (uint)(byte)_nPrefix->aNode[_nPrefix->iOff];
      local_30 = 1;
    }
    else {
      local_30 = sqlite3Fts3GetVarint32(_nPrefix->aNode + _nPrefix->iOff,(int *)&local_24);
    }
    _nPrefix->iOff = local_30 + _nPrefix->iOff;
    if ((_nPrefix->iOff < rc) || (_nPrefix->nNode - _nPrefix->iOff < (int)local_24)) {
      return 0x10b;
    }
    blobGrowBuffer(&_nPrefix->term,rc + local_24,&local_28);
    if (local_28 == 0) {
      memcpy((_nPrefix->term).a + rc,_nPrefix->aNode + _nPrefix->iOff,(long)(int)local_24);
      (_nPrefix->term).n = rc + local_24;
      _nPrefix->iOff = local_24 + _nPrefix->iOff;
      if (_nPrefix->iChild == 0) {
        if ((_nPrefix->aNode[_nPrefix->iOff] & 0x80U) == 0) {
          _nPrefix->nDoclist = (uint)(byte)_nPrefix->aNode[_nPrefix->iOff];
          local_34 = 1;
        }
        else {
          local_34 = sqlite3Fts3GetVarint32(_nPrefix->aNode + _nPrefix->iOff,&_nPrefix->nDoclist);
        }
        _nPrefix->iOff = local_34 + _nPrefix->iOff;
        if (_nPrefix->nNode - _nPrefix->iOff < _nPrefix->nDoclist) {
          return 0x10b;
        }
        _nPrefix->aDoclist = _nPrefix->aNode + _nPrefix->iOff;
        _nPrefix->iOff = _nPrefix->nDoclist + _nPrefix->iOff;
      }
    }
  }
  else {
    p->aNode = (char *)0x0;
  }
  return local_28;
}

Assistant:

static int nodeReaderNext(NodeReader *p){
  int bFirst = (p->term.n==0);    /* True for first term on the node */
  int nPrefix = 0;                /* Bytes to copy from previous term */
  int nSuffix = 0;                /* Bytes to append to the prefix */
  int rc = SQLITE_OK;             /* Return code */

  assert( p->aNode );
  if( p->iChild && bFirst==0 ) p->iChild++;
  if( p->iOff>=p->nNode ){
    /* EOF */
    p->aNode = 0;
  }else{
    if( bFirst==0 ){
      p->iOff += fts3GetVarint32(&p->aNode[p->iOff], &nPrefix);
    }
    p->iOff += fts3GetVarint32(&p->aNode[p->iOff], &nSuffix);

    if( nPrefix>p->iOff || nSuffix>p->nNode-p->iOff ){
      return FTS_CORRUPT_VTAB;
    }
    blobGrowBuffer(&p->term, nPrefix+nSuffix, &rc);
    if( rc==SQLITE_OK ){
      memcpy(&p->term.a[nPrefix], &p->aNode[p->iOff], nSuffix);
      p->term.n = nPrefix+nSuffix;
      p->iOff += nSuffix;
      if( p->iChild==0 ){
        p->iOff += fts3GetVarint32(&p->aNode[p->iOff], &p->nDoclist);
        if( (p->nNode-p->iOff)<p->nDoclist ){
          return FTS_CORRUPT_VTAB;
        }
        p->aDoclist = &p->aNode[p->iOff];
        p->iOff += p->nDoclist;
      }
    }
  }

  assert( p->iOff<=p->nNode );
  return rc;
}